

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

int stb_perfect_create(stb_perfect *p,uint *v,int n)

{
  short *psVar1;
  size_t __n;
  undefined1 auVar2 [16];
  int iVar3;
  undefined1 *__ptr;
  undefined1 *__ptr_00;
  undefined1 *__ptr_01;
  ulong uVar4;
  ushort *puVar5;
  size_t __nmemb;
  undefined1 *__ptr_02;
  long lVar6;
  stb_uint32 *psVar7;
  ulong uVar8;
  ushort *puVar9;
  stb_uint16 *psVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  size_t sVar14;
  uint uVar15;
  undefined1 *puVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ushort uVar21;
  size_t sVar22;
  ulong uVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  uint buffer5 [32];
  uint buffer3 [64];
  uint buffer4 [64];
  uint buffer2 [64];
  uint buffer1 [64];
  undefined1 local_4b8 [128];
  ushort local_438 [128];
  undefined1 local_338 [256];
  undefined1 local_238 [256];
  undefined1 local_138 [264];
  long lVar27;
  
  __n = (long)n * 4;
  uVar18 = (uint)__n;
  if ((int)uVar18 < 0x101) {
    __ptr_00 = local_238;
    __ptr = local_138;
  }
  else {
    __ptr = (undefined1 *)malloc((ulong)(uVar18 & 0x7ffffffc));
    __ptr_00 = (undefined1 *)malloc((ulong)(uVar18 & 0x7ffffffc));
  }
  if (n * 2 < 0x101) {
    __ptr_01 = local_338;
  }
  else {
    __ptr_01 = (undefined1 *)malloc((ulong)(uint)(n * 2));
  }
  if (0x8000 < n) {
    __assert_fail("n <= 32768",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0xde7,"int stb_perfect_create(stb_perfect *, unsigned int *, int)");
  }
  iVar3 = stb_log2_floor(n);
  uVar17 = (ulong)(uint)(1 << (((n & n - 1U) != 0) + (char)iVar3 & 0x1fU));
  p->large_bmap = (stb_uint16 *)0x0;
  uVar4 = (ulong)(uint)n;
  iVar3 = 8;
  uVar12 = 0;
  do {
    puVar5 = local_438;
    if (0x100 < iVar3 * 0x10) {
      puVar5 = (ushort *)malloc((ulong)(uint)(iVar3 * 0x10));
    }
    __nmemb = (size_t)iVar3;
    __ptr_02 = local_4b8;
    uVar19 = (uint)(__nmemb * 2);
    if (0x80 < (int)uVar19) {
      __ptr_02 = (undefined1 *)malloc((ulong)(uVar19 & 0x7ffffffe));
    }
    lVar6 = stb__perfect_rand_stb__rand * 0x7ff8a3ed + 0x2aa01d31;
    p->addend = (int)((ulong)lVar6 >> 0x10) + (int)lVar6 * 0x10000 ^ 0x31415926;
    stb__perfect_rand_stb__rand = lVar6 * 0x7ff8a3ed + 0x2aa01d31;
    uVar20 = (int)((ulong)stb__perfect_rand_stb__rand >> 0x10) +
             (int)stb__perfect_rand_stb__rand * 0x10000 & 0xfffffffeU ^ 0x31415927;
    p->multiplicand = uVar20;
    uVar19 = (uint)uVar17;
    p->table_mask = uVar19 - 1;
    p->b_mask = iVar3 - 1U;
    sVar22 = (long)(int)uVar19 << 2;
    psVar7 = (stb_uint32 *)malloc(sVar22);
    p->table = psVar7;
    if (0 < iVar3) {
      puVar9 = puVar5 + 2;
      sVar14 = 0;
      do {
        puVar9[-1] = (ushort)sVar14;
        puVar9[-2] = 0;
        *puVar9 = 0;
        sVar14 = sVar14 + 1;
        puVar9 = puVar9 + 8;
      } while (__nmemb != sVar14);
    }
    if (0 < n) {
      uVar8 = 0;
      do {
        uVar15 = v[uVar8] * uVar20;
        uVar13 = v[uVar8] >> 0x10;
        uVar24 = (uVar15 >> 0x18) + uVar13 & iVar3 - 1U;
        psVar1 = (short *)((long)puVar5 + (ulong)((uVar24 & 0xffff) << 4));
        *psVar1 = *psVar1 + 1;
        *(short *)(__ptr_00 + uVar8 * 2) = (short)uVar24;
        *(ushort *)(__ptr + uVar8 * 2) = (ushort)(uVar13 + uVar15 >> 0xc) & (ushort)(uVar19 - 1);
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
    qsort(puVar5,__nmemb,0x10,stb__slot_compare);
    if (0 < iVar3) {
      sVar14 = 0;
      puVar9 = puVar5;
      puVar16 = __ptr_01;
      do {
        *(undefined1 **)(puVar9 + 4) = puVar16;
        puVar16 = puVar16 + (ulong)*puVar9 * 2;
        *puVar9 = 0;
        *(short *)(__ptr_02 + (ulong)puVar9[1] * 2) = (short)sVar14;
        sVar14 = sVar14 + 1;
        puVar9 = puVar9 + 8;
      } while (__nmemb != sVar14);
    }
    if (0 < n) {
      uVar8 = 0;
      do {
        uVar23 = (ulong)*(ushort *)(__ptr_02 + (ulong)*(ushort *)(__ptr_00 + uVar8 * 2) * 2);
        lVar6 = *(long *)(puVar5 + uVar23 * 8 + 4);
        uVar21 = puVar5[uVar23 * 8];
        puVar5[uVar23 * 8] = uVar21 + 1;
        *(short *)(lVar6 + (ulong)uVar21 * 2) = (short)uVar8;
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
    if (__ptr_02 != local_4b8) {
      free(__ptr_02);
    }
    if (iVar3 < 1) {
      sVar14 = 0;
      memset(p->table,0,sVar22);
    }
    else {
      sVar14 = 0;
      do {
        if ((ulong)puVar5[sVar14 * 8] != 0) {
          uVar8 = 0;
          do {
            if (*(ushort *)
                 (__ptr_00 + (ulong)*(ushort *)(*(long *)(puVar5 + sVar14 * 8 + 4) + uVar8 * 2) * 2)
                != puVar5[sVar14 * 8 + 1]) {
              __assert_fail("bs[bcount[i].entries[j]] == bcount[i].b",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                            ,0xe11,"int stb_perfect_create(stb_perfect *, unsigned int *, int)");
            }
            uVar8 = uVar8 + 1;
          } while (puVar5[sVar14 * 8] != uVar8);
        }
        sVar14 = sVar14 + 1;
      } while (sVar14 != __nmemb);
      sVar14 = 0;
      memset(p->table,0,sVar22);
      if (0 < iVar3) {
        sVar22 = 0;
        do {
          uVar8 = (ulong)puVar5[sVar22 * 8];
          if (1 < uVar8) {
            psVar7 = p->table;
            lVar6 = *(long *)(puVar5 + sVar22 * 8 + 4);
            uVar23 = 0;
            bVar11 = false;
            do {
              if (psVar7[*(ushort *)(__ptr + (ulong)*(ushort *)(lVar6 + uVar23 * 2) * 2)] != 0) {
                bVar11 = true;
              }
              psVar7[*(ushort *)(__ptr + (ulong)*(ushort *)(lVar6 + uVar23 * 2) * 2)] = 1;
              uVar23 = uVar23 + 1;
            } while (uVar8 != uVar23);
            uVar23 = 0;
            do {
              psVar7[*(ushort *)(__ptr + (ulong)*(ushort *)(lVar6 + uVar23 * 2) * 2)] = 0;
              uVar23 = uVar23 + 1;
            } while (uVar8 != uVar23);
            if (bVar11) goto LAB_0014f91a;
          }
          sVar22 = sVar22 + 1;
        } while (sVar22 != __nmemb);
        if (0 < iVar3) {
          sVar14 = 0;
          do {
            uVar8 = (ulong)puVar5[sVar14 * 8];
            if (uVar8 != 0) {
              if ((int)uVar19 < 1) {
                uVar20 = 0;
              }
              else {
                lVar6 = *(long *)(puVar5 + sVar14 * 8 + 4);
                psVar7 = p->table;
                uVar20 = 0;
                while( true ) {
                  uVar23 = 0;
                  while (psVar7[(*(ushort *)(__ptr + (ulong)*(ushort *)(lVar6 + uVar23 * 2) * 2) ^
                                uVar20) & p->table_mask] == 0) {
                    uVar23 = uVar23 + 1;
                    if (uVar8 == uVar23) goto LAB_0014f895;
                  }
                  if (uVar8 == uVar23) break;
                  uVar20 = uVar20 + 1;
                  if (uVar20 == uVar19) goto LAB_0014f90c;
                }
LAB_0014f895:
                puVar5[sVar14 * 8 + 2] = (ushort)uVar20;
                uVar23 = 0;
                do {
                  psVar7[(*(ushort *)(__ptr + (ulong)*(ushort *)(lVar6 + uVar23 * 2) * 2) ^ uVar20)
                         & p->table_mask] = 1;
                  uVar23 = uVar23 + 1;
                } while (uVar8 != uVar23);
              }
              if (uVar20 == uVar19) break;
            }
            sVar14 = sVar14 + 1;
            if (sVar14 == __nmemb) goto LAB_0014fa28;
          } while( true );
        }
      }
    }
LAB_0014f90c:
    if ((int)sVar14 == iVar3) {
LAB_0014fa28:
      if ((iVar3 < 0x11) && ((int)uVar19 < 0x101)) {
        p->large_bmap = (stb_uint16 *)0x0;
        if (0 < iVar3) {
          lVar6 = 0;
          do {
            p->small_bmap[*(ushort *)((long)puVar5 + lVar6 + 2)] =
                 *(stb_uint8 *)((long)puVar5 + lVar6 + 4);
            lVar6 = lVar6 + 0x10;
          } while (__nmemb * 0x10 != lVar6);
        }
      }
      else {
        psVar10 = (stb_uint16 *)malloc(__nmemb * 2);
        p->large_bmap = psVar10;
        if (0 < iVar3) {
          lVar6 = 0;
          do {
            psVar10[*(ushort *)((long)puVar5 + lVar6 + 2)] =
                 *(stb_uint16 *)((long)puVar5 + lVar6 + 4);
            lVar6 = lVar6 + 0x10;
          } while (__nmemb << 4 != lVar6);
        }
      }
      auVar2 = _DAT_0016b030;
      if (0 < (int)uVar19) {
        psVar7 = p->table;
        uVar18 = *v;
        lVar6 = uVar17 - 1;
        auVar25._8_4_ = (int)lVar6;
        auVar25._0_8_ = lVar6;
        auVar25._12_4_ = (int)((ulong)lVar6 >> 0x20);
        lVar6 = 0;
        auVar25 = auVar25 ^ _DAT_0016b030;
        auVar26 = _DAT_001bb890;
        auVar28 = _DAT_001bb8a0;
        do {
          auVar29 = auVar28 ^ auVar2;
          iVar3 = auVar25._4_4_;
          if ((bool)(~(auVar29._4_4_ == iVar3 && auVar25._0_4_ < auVar29._0_4_ ||
                      iVar3 < auVar29._4_4_) & 1)) {
            *(uint *)((long)psVar7 + lVar6) = uVar18;
          }
          if ((auVar29._12_4_ != auVar25._12_4_ || auVar29._8_4_ <= auVar25._8_4_) &&
              auVar29._12_4_ <= auVar25._12_4_) {
            *(uint *)((long)psVar7 + lVar6 + 4) = uVar18;
          }
          auVar29 = auVar26 ^ auVar2;
          iVar30 = auVar29._4_4_;
          if (iVar30 <= iVar3 && (iVar30 != iVar3 || auVar29._0_4_ <= auVar25._0_4_)) {
            *(uint *)((long)psVar7 + lVar6 + 8) = uVar18;
            *(uint *)((long)psVar7 + lVar6 + 0xc) = uVar18;
          }
          lVar27 = auVar28._8_8_;
          auVar28._0_8_ = auVar28._0_8_ + 4;
          auVar28._8_8_ = lVar27 + 4;
          lVar27 = auVar26._8_8_;
          auVar26._0_8_ = auVar26._0_8_ + 4;
          auVar26._8_8_ = lVar27 + 4;
          lVar6 = lVar6 + 0x10;
        } while ((ulong)(uVar19 + 3 >> 2) << 4 != lVar6);
      }
      if (0 < n) {
        psVar10 = p->large_bmap;
        psVar7 = p->table;
        uVar17 = 0;
        do {
          if (psVar10 == (stb_uint16 *)0x0) {
            uVar21 = (ushort)p->small_bmap[*(ushort *)(__ptr_00 + uVar17 * 2)];
          }
          else {
            uVar21 = psVar10[*(ushort *)(__ptr_00 + uVar17 * 2)];
          }
          psVar7[*(ushort *)(__ptr + uVar17 * 2) ^ uVar21] = v[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar4 != uVar17);
        if (0 < n) {
          uVar17 = 0;
          do {
            iVar3 = stb_perfect_hash(p,v[uVar17]);
            if (iVar3 < 0) {
              __assert_fail("stb_perfect_hash(p, v[i]) >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                            ,0xe56,"int stb_perfect_create(stb_perfect *, unsigned int *, int)");
            }
            uVar17 = uVar17 + 1;
          } while (uVar4 != uVar17);
        }
      }
      if (puVar5 != local_438) {
        free(puVar5);
      }
      goto LAB_0014fc3b;
    }
    psVar7 = p->table;
LAB_0014f91a:
    free(psVar7);
    p->table = (stb_uint32 *)0x0;
    if (puVar5 != local_438) {
      free(puVar5);
    }
    uVar20 = uVar12 + 1;
    bVar11 = ((int)uVar19 < n * 4 && 6 < (int)uVar12) && (uVar20 & 3) == 0;
    iVar3 = (iVar3 << (iVar3 < (int)uVar19 && 2 < (int)uVar12)) << bVar11;
    uVar17 = (ulong)(uVar19 << bVar11);
    uVar12 = uVar20;
    if (uVar20 == 6) {
      puVar5 = local_438;
      if (0x100 < (int)uVar18) {
        puVar5 = (ushort *)malloc((ulong)(uVar18 & 0x7ffffffc));
      }
      memcpy(puVar5,v,__n);
      stb__intcmpoffset = 0;
      qsort(puVar5,(long)n,4,stb__intcmp);
      if (1 < n) {
        uVar8 = 1;
        do {
          if (*(int *)(puVar5 + uVar8 * 2) == *(int *)(puVar5 + uVar8 * 2 + -2)) {
            uVar17 = 0;
          }
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
      }
      if (puVar5 != local_438) {
        free(puVar5);
      }
      uVar12 = 6;
      if ((int)uVar17 == 0) {
        uVar19 = 0;
LAB_0014fc3b:
        if (stb_perfect_hash_max_failures < (int)uVar12) {
          stb_perfect_hash_max_failures = uVar12;
        }
        if (__ptr != local_138) {
          free(__ptr);
        }
        if (__ptr_00 != local_238) {
          free(__ptr_00);
        }
        if (__ptr_01 != local_338) {
          free(__ptr_01);
        }
        return uVar19;
      }
    }
  } while( true );
}

Assistant:

int stb_perfect_create(stb_perfect *p, unsigned int *v, int n)
{
   unsigned int buffer1[64], buffer2[64], buffer3[64], buffer4[64], buffer5[32];
   unsigned short *as = (unsigned short *) stb_temp(buffer1, sizeof(*v)*n);
   unsigned short *bs = (unsigned short *) stb_temp(buffer2, sizeof(*v)*n);
   unsigned short *entries = (unsigned short *) stb_temp(buffer4, sizeof(*entries) * n);
   int size = 1 << stb_log2_ceil(n), bsize=8;
   int failure = 0,i,j,k;

   assert(n <= 32768);
   p->large_bmap = NULL;

   for(;;) {
      stb__slot *bcount = (stb__slot *) stb_temp(buffer3, sizeof(*bcount) * bsize);
      unsigned short *bloc = (unsigned short *) stb_temp(buffer5, sizeof(*bloc) * bsize);
      unsigned short *e;
      int bad=0;

      p->addend = stb__perfect_rand();
      p->multiplicand = stb__perfect_rand() | 1;
      p->table_mask = size-1;
      p->b_mask = bsize-1;
      p->table = (stb_uint32 *) malloc(size * sizeof(*p->table));

      for (i=0; i < bsize; ++i) {
         bcount[i].b     = i;
         bcount[i].count = 0;
         bcount[i].map   = 0;
      }
      for (i=0; i < n; ++i) {
         stb__perfect_prehash(p, v[i], as+i, bs+i);
         ++bcount[bs[i]].count;
      }
      qsort(bcount, bsize, sizeof(*bcount), stb__slot_compare);
      e = entries; // now setup up their entries index
      for (i=0; i < bsize; ++i) {
         bcount[i].entries = e;
         e += bcount[i].count;
         bcount[i].count = 0;
         bloc[bcount[i].b] = i;
      }
      // now fill them out
      for (i=0; i < n; ++i) {
         int b = bs[i];
         int w = bloc[b];
         bcount[w].entries[bcount[w].count++] = i;
      }
      stb_tempfree(buffer5,bloc);
      // verify
      for (i=0; i < bsize; ++i)
         for (j=0; j < bcount[i].count; ++j)
            assert(bs[bcount[i].entries[j]] == bcount[i].b);
      memset(p->table, 0, size*sizeof(*p->table));

      // check if any b has duplicate a
      for (i=0; i < bsize; ++i) {
         if (bcount[i].count > 1) {
            for (j=0; j < bcount[i].count; ++j) {
               if (p->table[as[bcount[i].entries[j]]])
                  bad = 1;
               p->table[as[bcount[i].entries[j]]] = 1;
            }
            for (j=0; j < bcount[i].count; ++j) {
               p->table[as[bcount[i].entries[j]]] = 0;
            }
            if (bad) break;
         }
      }

      if (!bad) {
         // go through the bs and populate the table, first fit
         for (i=0; i < bsize; ++i) {
            if (bcount[i].count) {
               // go through the candidate table[b] values
               for (j=0; j < size; ++j) {
                  // go through the a values and see if they fit
                  for (k=0; k < bcount[i].count; ++k) {
                     int a = as[bcount[i].entries[k]];
                     if (p->table[(a^j)&p->table_mask]) {
                        break; // fails
                     }
                  }
                  // if succeeded, accept
                  if (k == bcount[i].count) {
                     bcount[i].map = j;
                     for (k=0; k < bcount[i].count; ++k) {
                        int a = as[bcount[i].entries[k]];
                        p->table[(a^j)&p->table_mask] = 1;
                     }
                     break;
                  }
               }
               if (j == size)
                  break; // no match for i'th entry, so break out in failure
            }
         }
         if (i == bsize) {
            // success... fill out map
            if (bsize <= 16 && size <= 256) {
               p->large_bmap = NULL;
               for (i=0; i < bsize; ++i)
                  p->small_bmap[bcount[i].b] = (stb_uint8) bcount[i].map;
            } else {
               p->large_bmap = (unsigned short *) malloc(sizeof(*p->large_bmap) * bsize);
               for (i=0; i < bsize; ++i)
                  p->large_bmap[bcount[i].b] = bcount[i].map;
            }

            // initialize table to v[0], so empty slots will fail
            for (i=0; i < size; ++i)
               p->table[i] = v[0];

            for (i=0; i < n; ++i)
               if (p->large_bmap)
                  p->table[as[i] ^ p->large_bmap[bs[i]]] = v[i];
               else
                  p->table[as[i] ^ p->small_bmap[bs[i]]] = v[i];

            // and now validate that none of them collided
            for (i=0; i < n; ++i)
               assert(stb_perfect_hash(p, v[i]) >= 0);

            stb_tempfree(buffer3, bcount);
            break;
         }
      }
      free(p->table);
      p->table = NULL;
      stb_tempfree(buffer3, bcount);

      ++failure;
      if (failure >= 4 && bsize < size) bsize *= 2;
      if (failure >= 8 && (failure & 3) == 0 && size < 4*n) {
         size *= 2;
         bsize *= 2;
      }
      if (failure == 6) {
         // make sure the input data is unique, so we don't infinite loop
         unsigned int *data = (unsigned int *) stb_temp(buffer3, n * sizeof(*data));
         memcpy(data, v, sizeof(*data) * n);
         qsort(data, n, sizeof(*data), stb_intcmp(0));
         for (i=1; i < n; ++i) {
            if (data[i] == data[i-1])
               size = 0; // size is return value, so 0 it
         }
         stb_tempfree(buffer3, data);
         if (!size) break;
      }
   }

   if (failure > stb_perfect_hash_max_failures)
      stb_perfect_hash_max_failures = failure;

   stb_tempfree(buffer1, as);
   stb_tempfree(buffer2, bs);
   stb_tempfree(buffer4, entries);

   return size;
}